

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O2

string * __thiscall
(anonymous_namespace)::gtest_CAV1FwdTxfm2d_EvalGenerateName__abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *info)

{
  bool bVar1;
  TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *extraout_RDX;
  TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *extraout_RDX_00;
  TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *info_00;
  tuple<testing::internal::ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
  t;
  __shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>,_(__gnu_cxx::_Lock_policy)2>
  local_50;
  _Vector_base<std::tuple<unsigned_char,_unsigned_char,_double,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
  local_40;
  __shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>,_(__gnu_cxx::_Lock_policy)2>
  local_28;
  
  bVar1 = testing::internal::AlwaysFalse();
  info_00 = extraout_RDX;
  if (bVar1) {
    anon_unknown.dwarf_15c76d4::GetTxfm2dParamList();
    testing::
    ValuesIn<std::vector<std::tuple<unsigned_char,unsigned_char,double,double>,std::allocator<std::tuple<unsigned_char,unsigned_char,double,double>>>>
              ((testing *)&local_50,
               (vector<std::tuple<unsigned_char,_unsigned_char,_double,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
                *)&local_40);
    std::
    __shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_28,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::
    _Vector_base<std::tuple<unsigned_char,_unsigned_char,_double,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
    ::~_Vector_base(&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    info_00 = extraout_RDX_00;
  }
  testing::internal::DefaultParamName<std::tuple<unsigned_char,unsigned_char,double,double>>
            (__return_storage_ptr__,(internal *)this,info_00);
  return __return_storage_ptr__;
}

Assistant:

TEST_P(AV1FwdTxfm2d, RunFwdAccuracyCheck) { RunFwdAccuracyCheck(); }